

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGValidateDefinitionList
              (xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict defines)

{
  int iVar1;
  char *arg1;
  int iVar2;
  xmlRelaxNGValidErr err;
  
  if (defines == (xmlRelaxNGDefinePtr_conflict)0x0) {
    arg1 = "NULL definition list";
    err = XML_RELAXNG_ERR_INTERNAL;
LAB_0017f1c7:
    xmlRelaxNGAddValidError(ctxt,err,(xmlChar *)arg1,(xmlChar *)0x0,0);
    iVar2 = -1;
  }
  else {
    iVar2 = 0;
    do {
      if ((ctxt->state == (xmlRelaxNGValidStatePtr)0x0) &&
         (ctxt->states == (xmlRelaxNGStatesPtr)0x0)) {
        err = XML_RELAXNG_ERR_NOSTATE;
        arg1 = (char *)0x0;
        goto LAB_0017f1c7;
      }
      iVar1 = xmlRelaxNGValidateDefinition(ctxt,defines);
      if (iVar1 < 0) {
        iVar2 = -1;
      }
    } while ((iVar1 != -1) && (defines = defines->next, defines != (xmlRelaxNGDefinePtr)0x0));
  }
  return iVar2;
}

Assistant:

static int
xmlRelaxNGValidateDefinitionList(xmlRelaxNGValidCtxtPtr ctxt,
                                 xmlRelaxNGDefinePtr defines)
{
    int ret = 0, res;


    if (defines == NULL) {
        VALID_ERR2(XML_RELAXNG_ERR_INTERNAL,
                   BAD_CAST "NULL definition list");
        return (-1);
    }
    while (defines != NULL) {
        if ((ctxt->state != NULL) || (ctxt->states != NULL)) {
            res = xmlRelaxNGValidateDefinition(ctxt, defines);
            if (res < 0)
                ret = -1;
        } else {
            VALID_ERR(XML_RELAXNG_ERR_NOSTATE);
            return (-1);
        }
        if (res == -1)          /* continues on -2 */
            break;
        defines = defines->next;
    }

    return (ret);
}